

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v10::detail::
     handle_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
               (int *value,arg_ref<char> ref,basic_format_context<fmt::v10::appender,_char> *ctx)

{
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg;
  int iVar1;
  size_t in_R8;
  format_arg *__return_storage_ptr__;
  basic_string_view<char> id;
  undefined8 in_stack_ffffffffffffffa8;
  format_arg local_38;
  
  if (ref.kind == name) {
    __return_storage_ptr__ = (format_arg *)&stack0xffffffffffffffa8;
    id.size_ = in_R8;
    id.data_ = (char *)ref.val.name.size_;
    get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::basic_string_view<char>>
              (__return_storage_ptr__,(detail *)ctx,ref.val._0_8_,id);
  }
  else {
    if (ref.kind != index) {
      return;
    }
    __return_storage_ptr__ = &local_38;
    get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
              (__return_storage_ptr__,(detail *)ctx,
               (basic_format_context<fmt::v10::appender,_char> *)(ulong)(uint)ref.val.index,1);
  }
  arg._24_8_ = in_stack_ffffffffffffffa8;
  arg._0_24_ = *(undefined1 (*) [24])((long)&(__return_storage_ptr__->value_).field_0 + 8);
  iVar1 = get_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
                    (arg);
  *value = iVar1;
  return;
}

Assistant:

FMT_CONSTEXPR void handle_dynamic_spec(int& value,
                                       arg_ref<typename Context::char_type> ref,
                                       Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.index));
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.name));
    break;
  }
}